

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizerParameters.cpp
# Opt level: O2

void __thiscall OpenMD::MinimizerParameters::MinimizerParameters(MinimizerParameters *this)

{
  ParamMap *this_00;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_b1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_90;
  ParameterBase *local_68;
  ParameterBase *local_60;
  ParameterBase *local_58;
  ParameterBase *local_50;
  ParameterBase *local_48;
  ParameterBase *local_40;
  Parameter<bool> *local_38;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__MinimizerParameters_002860c8;
  (this->UseMinimizer).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseMinimizer).super_ParameterBase.keyword_.field_2;
  (this->UseMinimizer).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseMinimizer).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseMinimizer).super_ParameterBase.optional_ = false;
  (this->UseMinimizer).super_ParameterBase.defaultValue_ = false;
  (this->UseMinimizer).super_ParameterBase.empty_ = true;
  (this->UseMinimizer).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00285420;
  this_01 = &this->Method;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(this_01);
  local_40 = &(this->MaxIterations).super_ParameterBase;
  (this->MaxIterations).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MaxIterations).super_ParameterBase.keyword_.field_2;
  (this->MaxIterations).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MaxIterations).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MaxIterations).super_ParameterBase.optional_ = false;
  (this->MaxIterations).super_ParameterBase.defaultValue_ = false;
  (this->MaxIterations).super_ParameterBase.empty_ = true;
  (this->MaxIterations).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00285510;
  (this->MaxStationaryStateIterations).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MaxStationaryStateIterations).super_ParameterBase.keyword_.field_2;
  (this->MaxStationaryStateIterations).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MaxStationaryStateIterations).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MaxStationaryStateIterations).super_ParameterBase.optional_ = false;
  (this->MaxStationaryStateIterations).super_ParameterBase.defaultValue_ = false;
  local_48 = &(this->MaxStationaryStateIterations).super_ParameterBase;
  (this->MaxStationaryStateIterations).super_ParameterBase.empty_ = true;
  (this->MaxStationaryStateIterations).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00285510;
  (this->RootEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->RootEpsilon).super_ParameterBase.keyword_.field_2;
  (this->RootEpsilon).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RootEpsilon).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RootEpsilon).super_ParameterBase.optional_ = false;
  (this->RootEpsilon).super_ParameterBase.defaultValue_ = false;
  (this->RootEpsilon).super_ParameterBase.empty_ = true;
  (this->RootEpsilon).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00285498;
  (this->FunctionEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->FunctionEpsilon).super_ParameterBase.keyword_.field_2;
  (this->FunctionEpsilon).super_ParameterBase.keyword_._M_string_length = 0;
  (this->FunctionEpsilon).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->FunctionEpsilon).super_ParameterBase.optional_ = false;
  (this->FunctionEpsilon).super_ParameterBase.defaultValue_ = false;
  local_50 = &(this->RootEpsilon).super_ParameterBase;
  (this->FunctionEpsilon).super_ParameterBase.empty_ = true;
  (this->FunctionEpsilon).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00285498;
  (this->GradientNormEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->GradientNormEpsilon).super_ParameterBase.keyword_.field_2;
  (this->GradientNormEpsilon).super_ParameterBase.keyword_._M_string_length = 0;
  (this->GradientNormEpsilon).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->GradientNormEpsilon).super_ParameterBase.optional_ = false;
  (this->GradientNormEpsilon).super_ParameterBase.defaultValue_ = false;
  local_58 = &(this->FunctionEpsilon).super_ParameterBase;
  (this->GradientNormEpsilon).super_ParameterBase.empty_ = true;
  (this->GradientNormEpsilon).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00285498;
  (this->InitialStepSize).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->InitialStepSize).super_ParameterBase.keyword_.field_2;
  (this->InitialStepSize).super_ParameterBase.keyword_._M_string_length = 0;
  (this->InitialStepSize).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->InitialStepSize).super_ParameterBase.optional_ = false;
  (this->InitialStepSize).super_ParameterBase.defaultValue_ = false;
  local_60 = &(this->GradientNormEpsilon).super_ParameterBase;
  local_68 = &(this->InitialStepSize).super_ParameterBase;
  (this->InitialStepSize).super_ParameterBase.empty_ = true;
  (this->InitialStepSize).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00285498;
  local_38 = &this->UseMinimizer;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"useMinimizer",(allocator<char> *)&local_b0);
  std::__cxx11::string::_M_assign((string *)&(this->UseMinimizer).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_90);
  (this->UseMinimizer).super_ParameterBase.optional_ = true;
  (this->UseMinimizer).super_ParameterBase.defaultValue_ = true;
  (this->UseMinimizer).super_ParameterBase.empty_ = false;
  (this->UseMinimizer).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"useMinimizer",&local_b1);
  local_90.first._M_string_length = local_a8;
  this_00 = &(this->super_DataHolder).parameters_;
  paVar1 = &local_90.first.field_2;
  if (local_b0 == &local_a0) {
    local_90.first.field_2._8_8_ = local_a0._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_b0;
  }
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_b0 = &local_a0;
  local_90.second = &(this->UseMinimizer).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"method",(allocator<char> *)&local_b0);
  std::__cxx11::string::_M_assign((string *)&(this->Method).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_90);
  (this->Method).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"SD",(allocator<char> *)&local_b0);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(this_01,&local_90.first);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"method",&local_b1);
  local_90.first._M_string_length = local_a8;
  if (local_b0 == &local_a0) {
    local_90.first.field_2._8_8_ = local_a0._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_b0;
  }
  local_90.first.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_90.first.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_b0 = &local_a0;
  local_90.second = &this_01->super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"maxIterations",(allocator<char> *)&local_b0);
  std::__cxx11::string::_M_assign((string *)&(this->MaxIterations).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_90);
  (this->MaxIterations).super_ParameterBase.optional_ = true;
  (this->MaxIterations).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->MaxIterations).super_ParameterBase.field_0x2c = 1000;
  (this->MaxIterations).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"maxIterations",&local_b1);
  local_90.first._M_string_length = local_a8;
  if (local_b0 == &local_a0) {
    local_90.first.field_2._8_8_ = local_a0._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_b0;
  }
  local_90.first.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_90.first.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90.second = local_40;
  local_b0 = &local_a0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"maxStationaryStateIterations",(allocator<char> *)&local_b0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->MaxStationaryStateIterations).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_90);
  (this->MaxStationaryStateIterations).super_ParameterBase.optional_ = true;
  (this->MaxStationaryStateIterations).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->MaxStationaryStateIterations).super_ParameterBase.field_0x2c = 100;
  (this->MaxStationaryStateIterations).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"maxStationaryStateIterations",&local_b1);
  local_90.first._M_string_length = local_a8;
  if (local_b0 == &local_a0) {
    local_90.first.field_2._8_8_ = local_a0._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_b0;
  }
  local_90.first.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_90.first.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90.second = local_48;
  local_b0 = &local_a0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"rootEpsilon",(allocator<char> *)&local_b0);
  std::__cxx11::string::_M_assign((string *)&(this->RootEpsilon).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_90);
  (this->RootEpsilon).super_ParameterBase.optional_ = true;
  (this->RootEpsilon).super_ParameterBase.defaultValue_ = true;
  (this->RootEpsilon).data_ = 1e-05;
  (this->RootEpsilon).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"rootEpsilon",&local_b1);
  local_90.first._M_string_length = local_a8;
  if (local_b0 == &local_a0) {
    local_90.first.field_2._8_8_ = local_a0._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_b0;
  }
  local_90.first.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_90.first.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90.second = local_50;
  local_b0 = &local_a0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"functionEpsilon",(allocator<char> *)&local_b0);
  std::__cxx11::string::_M_assign((string *)&(this->FunctionEpsilon).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_90);
  (this->FunctionEpsilon).super_ParameterBase.optional_ = true;
  (this->FunctionEpsilon).super_ParameterBase.defaultValue_ = true;
  (this->FunctionEpsilon).data_ = 1e-05;
  (this->FunctionEpsilon).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"functionEpsilon",&local_b1);
  local_90.first._M_string_length = local_a8;
  if (local_b0 == &local_a0) {
    local_90.first.field_2._8_8_ = local_a0._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_b0;
  }
  local_90.first.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_90.first.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90.second = local_58;
  local_b0 = &local_a0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"gradientNormEpsilon",(allocator<char> *)&local_b0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->GradientNormEpsilon).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_90);
  (this->GradientNormEpsilon).super_ParameterBase.optional_ = true;
  (this->GradientNormEpsilon).super_ParameterBase.defaultValue_ = true;
  (this->GradientNormEpsilon).data_ = 1e-05;
  (this->GradientNormEpsilon).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"gradientNormEpsilon",&local_b1);
  local_90.first._M_string_length = local_a8;
  if (local_b0 == &local_a0) {
    local_90.first.field_2._8_8_ = local_a0._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_b0;
  }
  local_90.first.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_90.first.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90.second = local_60;
  local_b0 = &local_a0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"initialStepSize",(allocator<char> *)&local_b0);
  std::__cxx11::string::_M_assign((string *)&(this->InitialStepSize).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_90);
  (this->InitialStepSize).super_ParameterBase.optional_ = true;
  (this->InitialStepSize).super_ParameterBase.defaultValue_ = true;
  (this->InitialStepSize).data_ = 0.1;
  (this->InitialStepSize).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"initialStepSize",&local_b1);
  local_90.first._M_string_length = local_a8;
  if (local_b0 == &local_a0) {
    local_90.first.field_2._8_8_ = local_a0._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_b0;
  }
  local_90.first.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_90.first.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90.second = local_68;
  local_b0 = &local_a0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

MinimizerParameters::MinimizerParameters() {
    DefineOptionalParameterWithDefaultValue(UseMinimizer, "useMinimizer",
                                            false);
    DefineOptionalParameterWithDefaultValue(Method, "method", "SD");
    DefineOptionalParameterWithDefaultValue(MaxIterations, "maxIterations",
                                            1000);
    DefineOptionalParameterWithDefaultValue(
        MaxStationaryStateIterations, "maxStationaryStateIterations", 100);
    DefineOptionalParameterWithDefaultValue(RootEpsilon, "rootEpsilon", 1e-5);
    DefineOptionalParameterWithDefaultValue(FunctionEpsilon, "functionEpsilon",
                                            1e-5);
    DefineOptionalParameterWithDefaultValue(GradientNormEpsilon,
                                            "gradientNormEpsilon", 1e-5);
    DefineOptionalParameterWithDefaultValue(InitialStepSize, "initialStepSize",
                                            0.1);
  }